

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FieldDescriptor *field,bool is_setter_argument,bool force_present,
          bool singular_if_not_packed,BytesMode bytes_mode,bool force_singular)

{
  once_flag *poVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  long *plVar5;
  undefined7 extraout_var;
  string *psVar6;
  undefined7 extraout_var_00;
  string *extraout_RAX;
  FieldDescriptor *pFVar7;
  FieldDescriptor *pFVar8;
  FieldDescriptor *pFVar9;
  FieldDescriptor *pFVar10;
  undefined7 in_register_00000081;
  undefined3 in_stack_00000009;
  undefined1 local_78 [36];
  BytesMode local_54;
  undefined1 local_50 [32];
  
  pFVar7 = (FieldDescriptor *)local_78;
  pFVar8 = (FieldDescriptor *)local_78;
  pFVar9 = (FieldDescriptor *)local_78;
  pFVar10 = (FieldDescriptor *)local_78;
  local_54 = (BytesMode)CONCAT71(in_register_00000081,is_setter_argument);
  JSTypeName_abi_cxx11_
            (__return_storage_ptr__,this,options,(FieldDescriptor *)(ulong)_singular_if_not_packed,
             local_54);
  if ((((undefined1)bytes_mode == BYTES_DEFAULT) &&
      (*(int *)((long)&(options->namespace_prefix).field_2 + 0xc) == 3)) &&
     (bVar2 = FieldDescriptor::is_packed((FieldDescriptor *)options), bVar2 || !force_present)) {
    poVar1 = (once_flag *)(options->namespace_prefix).field_2._M_allocated_capacity;
    if (poVar1 != (once_flag *)0x0) {
      local_78._0_8_ = FieldDescriptor::TypeOnceInit;
      local_50._0_8_ = options;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (poVar1,(_func_void_FieldDescriptor_ptr **)local_78,(FieldDescriptor **)local_50);
    }
    if ((_singular_if_not_packed == 0) &&
       (*(int *)((long)&(options->namespace_prefix).field_2 + 8) == 0xc)) {
      this = (_anonymous_namespace_ *)0x0;
      std::__cxx11::string::_M_replace
                ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
                 0x39af5c);
    }
    else {
      bVar2 = anon_unknown_0::IsPrimitive(__return_storage_ptr__);
      if (!bVar2) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                       ,"!",__return_storage_ptr__);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_78);
        if ((string *)local_78._0_8_ != (string *)(local_78 + 0x10)) {
          operator_delete((void *)local_78._0_8_);
        }
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     "Array<",__return_storage_ptr__);
      plVar5 = (long *)std::__cxx11::string::append(local_50);
      psVar6 = (string *)(plVar5 + 2);
      if ((string *)*plVar5 == psVar6) {
        local_78._16_8_ = (psVar6->_M_dataplus)._M_p;
        local_78._24_8_ = plVar5[3];
        local_78._0_8_ = (string *)(local_78 + 0x10);
      }
      else {
        local_78._16_8_ = (psVar6->_M_dataplus)._M_p;
        local_78._0_8_ = (string *)*plVar5;
      }
      local_78._8_8_ = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_78);
      this = (_anonymous_namespace_ *)pFVar7;
      if ((string *)local_78._0_8_ != (string *)(local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_);
        this = (_anonymous_namespace_ *)pFVar7;
      }
      if ((GeneratorOptions *)local_50._0_8_ != (GeneratorOptions *)(local_50 + 0x10)) {
        operator_delete((void *)local_50._0_8_);
      }
    }
  }
  if ((char)field == '\0') {
    if (((undefined1)local_54 == '\0') &&
       (*(int *)((long)&(options->namespace_prefix).field_2 + 0xc) != 2)) {
      poVar1 = (once_flag *)(options->namespace_prefix).field_2._M_allocated_capacity;
      if (poVar1 != (once_flag *)0x0) {
        local_78._0_8_ = FieldDescriptor::TypeOnceInit;
        local_50._0_8_ = options;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (poVar1,(_func_void_FieldDescriptor_ptr **)local_78,(FieldDescriptor **)local_50);
        this = (_anonymous_namespace_ *)pFVar9;
      }
      uVar4 = *(uint *)((long)&(options->namespace_prefix).field_2 + 8);
      if (uVar4 != 0xe) {
        if (*(int *)((options->namespace_prefix)._M_string_length + 0x3c) == 3) {
          poVar1 = (once_flag *)(options->namespace_prefix).field_2._M_allocated_capacity;
          if (poVar1 != (once_flag *)0x0) {
            local_78._0_8_ = FieldDescriptor::TypeOnceInit;
            local_50._0_8_ = options;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (poVar1,(_func_void_FieldDescriptor_ptr **)local_78,
                       (FieldDescriptor **)local_50);
            uVar4 = *(uint *)((long)&(options->namespace_prefix).field_2 + 8);
            this = (_anonymous_namespace_ *)pFVar10;
          }
          if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)uVar4 * 4) != 10)
          goto LAB_0024fc8b;
        }
        bVar2 = anon_unknown_0::ReturnsNullWhenUnset(options,(FieldDescriptor *)this);
        if (bVar2) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_78,"?",__return_storage_ptr__);
          goto LAB_0024fca9;
        }
      }
    }
  }
  else {
    bVar2 = anon_unknown_0::ReturnsNullWhenUnset(options,(FieldDescriptor *)this);
    if (bVar2) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     "?",__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_78);
      this = (_anonymous_namespace_ *)pFVar8;
      if ((string *)local_78._0_8_ != (string *)(local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_);
        this = (_anonymous_namespace_ *)pFVar8;
      }
    }
    bVar3 = anon_unknown_0::ReturnsNullWhenUnset(options,(FieldDescriptor *)this);
    if (bVar3) {
      psVar6 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
      return psVar6;
    }
    if (bVar2) {
      return (string *)CONCAT71(extraout_var,bVar3);
    }
  }
LAB_0024fc8b:
  bVar2 = anon_unknown_0::IsPrimitive(__return_storage_ptr__);
  if (bVar2) {
    return (string *)CONCAT71(extraout_var_00,bVar2);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,"!",
                 __return_storage_ptr__);
LAB_0024fca9:
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_78);
  psVar6 = (string *)(local_78 + 0x10);
  if ((string *)local_78._0_8_ != psVar6) {
    operator_delete((void *)local_78._0_8_);
    psVar6 = extraout_RAX;
  }
  return psVar6;
}

Assistant:

std::string JSFieldTypeAnnotation(const GeneratorOptions& options,
                                  const FieldDescriptor* field,
                                  bool is_setter_argument, bool force_present,
                                  bool singular_if_not_packed,
                                  BytesMode bytes_mode = BYTES_DEFAULT,
                                  bool force_singular = false) {
  std::string jstype = JSTypeName(options, field, bytes_mode);

  if (!force_singular && field->is_repeated() &&
      (field->is_packed() || !singular_if_not_packed)) {
    if (field->type() == FieldDescriptor::TYPE_BYTES &&
        bytes_mode == BYTES_DEFAULT) {
      jstype = "(Array<!Uint8Array>|Array<string>)";
    } else {
      if (!IsPrimitive(jstype)) {
        jstype = "!" + jstype;
      }
      jstype = "Array<" + jstype + ">";
    }
  }

  bool is_null_or_undefined = false;

  if (is_setter_argument) {
    if (SetterAcceptsNull(options, field)) {
      jstype = "?" + jstype;
      is_null_or_undefined = true;
    }

    if (SetterAcceptsUndefined(options, field)) {
      jstype += "|undefined";
      is_null_or_undefined = true;
    }
  } else if (force_present) {
    // Don't add null or undefined.
  } else {
    if (DeclaredReturnTypeIsNullable(options, field)) {
      jstype = "?" + jstype;
      is_null_or_undefined = true;
    }
  }

  if (!is_null_or_undefined && !IsPrimitive(jstype)) {
    jstype = "!" + jstype;
  }

  return jstype;
}